

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cpp
# Opt level: O2

int repair_main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  bool bVar2;
  Status status;
  string path;
  ZlibCompressor zlib;
  ZlibCompressorRaw zlib_raw;
  string local_898;
  Options options;
  
  if ((2 < argc) && (iVar1 = strcmp("help",argv[1]), iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options,argv[2],(allocator<char> *)&zlib_raw);
    std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &options,"/db");
    std::__cxx11::string::~string((string *)&options);
    zlib_raw.super_ZlibCompressorBase.super_Compressor.inputBytes = 0;
    zlib_raw.super_ZlibCompressorBase.super_Compressor.compressedBytes = 0;
    zlib_raw.super_ZlibCompressorBase.super_Compressor.uniqueCompressionID = '\x04';
    zlib_raw.super_ZlibCompressorBase.super_Compressor._28_4_ = 0xffffffff;
    zlib_raw.super_ZlibCompressorBase.raw = true;
    zlib.super_ZlibCompressorBase.super_Compressor.inputBytes = 0;
    zlib.super_ZlibCompressorBase.super_Compressor.compressedBytes = 0;
    zlib.super_ZlibCompressorBase.super_Compressor.uniqueCompressionID = '\x02';
    zlib.super_ZlibCompressorBase.super_Compressor._28_4_ = 0xffffffff;
    zlib_raw.super_ZlibCompressorBase.super_Compressor._vptr_Compressor =
         (_func_int **)&PTR__Compressor_0012f0f0;
    zlib.super_ZlibCompressorBase.raw = false;
    zlib.super_ZlibCompressorBase.super_Compressor._vptr_Compressor =
         (_func_int **)&PTR__Compressor_0012f120;
    leveldb::Options::Options(&options);
    options.compressors[1] = (Compressor *)&zlib;
    status.state_ = (char *)0x0;
    options.compressors[0] = (Compressor *)&zlib_raw;
    leveldb::RepairDB((leveldb *)&local_898,&path,&options);
    status.state_ = local_898._M_dataplus._M_p;
    local_898._M_dataplus._M_p = (pointer)0x0;
    leveldb::Status::~Status((Status *)&local_898);
    __stream = _stderr;
    bVar2 = status.state_ != (char *)0x0;
    if (bVar2) {
      leveldb::Status::ToString_abi_cxx11_(&local_898,&status);
      fprintf(__stream,"ERROR: Repairing \'%s\' failed --- %s\n",path._M_dataplus._M_p,
              local_898._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_898);
    }
    leveldb::Status::~Status(&status);
    std::__cxx11::string::~string((string *)&path);
    return (uint)bVar2;
  }
  printf("Usage: %s repair <minecraft_world_dir>\n",*argv);
  return 1;
}

Assistant:

int repair_main(int argc, char *argv[]) {
    if(argc < 3 || strcmp("help", argv[1]) == 0) {
        printf("Usage: %s repair <minecraft_world_dir>\n", argv[0]);
        return EXIT_FAILURE;
    }

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";

    leveldb::ZlibCompressorRaw zlib_raw;
    leveldb::ZlibCompressor zlib;

    leveldb::Options options;
    options.compressors[0] = &zlib_raw;
    options.compressors[1] = &zlib;

    leveldb::Status status;
    status = leveldb::RepairDB(path, options);

    if(!status.ok()) {
        fprintf(stderr, "ERROR: Repairing '%s' failed --- %s\n", path.c_str(),
                status.ToString().c_str());
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}